

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Reset
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  SmallHeapBlockBitVector *pSVar4;
  undefined8 *in_FS_OFFSET;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pSVar4 = GetFreeBitVector(this);
  BVStatic<2048UL>::ClearAll(pSVar4);
  this->freeCount = 0;
  this->markCount = 0;
  this->lastFreeCount = this->objectCount;
  this->oldFreeCount = this->objectCount;
  this->freeObjectList = (FreeObject *)0x0;
  this->lastFreeObjectHead = (FreeObject *)0x0;
  ClearObjectInfoList(this);
  this->isInAllocator = false;
  pSVar4 = GetDebugFreeBitVector(this);
  BVStatic<2048UL>::ClearAll(pSVar4);
  this->isClearedFromAllocator = false;
  this->isIntegratedBlock = false;
  this->markBits = (SmallHeapBlockBitVector *)0x0;
  BVar3 = BVStatic<2048UL>::Count(&this->explicitFreeBits);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x21f,"(this->explicitFreeBits.Count() == 0)",
                       "this->explicitFreeBits.Count() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::Reset()
{
    this->GetFreeBitVector()->ClearAll();

    this->freeCount = 0;
    this->markCount = 0;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->hasFinishedSweepObjects = false;
        this->wasAllocatedFromDuringSweep = false;
        this->objectsMarkedDuringSweep = 0;
        this->objectsAllocatedDuringConcurrentSweepCount = 0;
        this->lastObjectsAllocatedDuringConcurrentSweepCount = 0;
#endif
        this->isPendingConcurrentSweepPrep = false;
    }
#endif

#if ENABLE_PARTIAL_GC
    this->oldFreeCount = this->lastFreeCount = this->objectCount;
#else
    this->lastFreeCount = this->objectCount;
#endif
    this->freeObjectList = nullptr;
    this->lastFreeObjectHead = nullptr;
    this->ClearObjectInfoList();

    this->isInAllocator = false;

#if DBG || defined(RECYCLER_STATS)
    this->GetDebugFreeBitVector()->ClearAll();
#endif

#if DBG
    this->isClearedFromAllocator = false;
    this->isIntegratedBlock = false;
#endif

    // There is no page associated with this heap block,
    // and therefore we should have no mark bits either
    this->markBits = nullptr;

    Assert(this->explicitFreeBits.Count() == 0);
}